

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.h
# Opt level: O0

GarbageCollectedBase * __thiscall
HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
::at(HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
     *this,LinkedNode *k)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false> _Var3;
  LinkedNode *pLVar4;
  _Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false> local_30;
  _Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false> local_28;
  iterator it;
  LinkedNode *k_local;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this_local;
  
  it.super__Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false>)
           (_Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false>)k
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<Member<LinkedNode>_*,_Member<LinkedNode>_*,_std::hash<Member<LinkedNode>_*>,_std::equal_to<Member<LinkedNode>_*>,_std::allocator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>_>_>
       ::begin(&this->map_);
  while( true ) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<Member<LinkedNode>_*,_Member<LinkedNode>_*,_std::hash<Member<LinkedNode>_*>,_std::equal_to<Member<LinkedNode>_*>,_std::allocator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>_>_>
         ::end(&this->map_);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return (GarbageCollectedBase *)0x0;
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false,_false>
                           *)&local_28);
    _Var3._M_cur = (__node_type *)Member<LinkedNode>::GetRaw(ppVar2->first);
    if ((_Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false>)
        _Var3._M_cur ==
        it.
        super__Node_iterator_base<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false>
        ._M_cur) break;
    std::__detail::
    _Node_iterator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false,_false>
                *)&local_28,0);
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false,_false>
           ::operator->((_Node_iterator<std::pair<Member<LinkedNode>_*const,_Member<LinkedNode>_*>,_false,_false>
                         *)&local_28);
  pLVar4 = Member<LinkedNode>::GetRaw(ppVar2->second);
  return (GarbageCollectedBase *)pLVar4;
}

Assistant:

GarbageCollectedBase *at(Key *k) {
    for (auto it = map_.begin(); it != map_.end(); it++) {
      if (it->first->GetRaw() == k) {
        return it->second->GetRaw();
      }
    }
    return nullptr;
  }